

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall
xatlas::internal::param::JacobiPreconditioner::JacobiPreconditioner
          (JacobiPreconditioner *this,Matrix *M,bool symmetric)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  FullVector::FullVector(&this->m_inverseDiagonal,M->m_width);
  if (s_print != (undefined *)0x0 && M->m_width != (M->m_array).m_base.size) {
    (*(code *)s_print)("\rASSERT: %s %s %d\n","M.isSquare()",
                       "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                       ,0x164b);
  }
  if (M->m_width != 0) {
    uVar1 = 0;
    do {
      fVar2 = sparse::Matrix::getCoefficient(M,(uint32_t)uVar1,(uint32_t)uVar1);
      if (symmetric) {
        fVar3 = 1.0;
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          fVar2 = ABS(fVar2);
          if (fVar2 < 0.0) {
            fVar2 = sqrtf(fVar2);
          }
          else {
            fVar2 = SQRT(fVar2);
          }
          fVar3 = 1.0 / fVar2;
        }
        if ((this->m_inverseDiagonal).m_array.m_base.size <= uVar1) {
LAB_001bac09:
          __assert_fail("index < m_base.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                        ,0x4ae,"T &xatlas::internal::Array<float>::operator[](uint32_t) [T = float]"
                       );
        }
      }
      else {
        if ((this->m_inverseDiagonal).m_array.m_base.size <= uVar1) goto LAB_001bac09;
        fVar3 = (float)(~-(uint)(fVar2 != 0.0) & 0x3f800000 |
                       (uint)(1.0 / fVar2) & -(uint)(fVar2 != 0.0));
      }
      *(float *)((this->m_inverseDiagonal).m_array.m_base.buffer + uVar1 * 4) = fVar3;
      uVar1 = uVar1 + 1;
    } while (uVar1 < M->m_width);
  }
  return;
}

Assistant:

JacobiPreconditioner(const sparse::Matrix &M, bool symmetric) : m_inverseDiagonal(M.width())
	{
		XA_ASSERT(M.isSquare());
		for (uint32_t x = 0; x < M.width(); x++) {
			float elem = M.getCoefficient(x, x);
			//XA_DEBUG_ASSERT( elem != 0.0f ); // This can be zero in the presence of zero area triangles.
			if (symmetric) {
				m_inverseDiagonal[x] = (elem != 0) ? 1.0f / sqrtf(fabsf(elem)) : 1.0f;
			} else {
				m_inverseDiagonal[x] = (elem != 0) ? 1.0f / elem : 1.0f;
			}
		}
	}